

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f * Matrix4f::rotateY(Matrix4f *__return_storage_ptr__,float radians)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos((double)radians);
  dVar2 = sin((double)radians);
  __return_storage_ptr__->m_elements[0] = (float)dVar1;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = -(float)dVar2;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 1.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = (float)dVar2;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = (float)dVar1;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::rotateY( float radians )
{
	float c = cos( radians );
	float s = sin( radians );

	return Matrix4f
	(
		c, 0, s, 0,
		0, 1, 0, 0,
		-s, 0, c, 0,
		0, 0, 0, 1
	);
}